

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O1

void __thiscall OpenMD::InteractionManager::doPair(InteractionManager *this,InteractionData *idat)

{
  long lVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  long lVar13;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  lVar13 = (long)idat->atid2;
  lVar1 = *(long *)&(this->iHash_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[idat->atid1].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
  if ((*(byte *)(lVar1 + lVar13 * 4) & 1) != 0) {
    peVar2 = (this->electrostatic_).
             super___shared_ptr<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_ElectrostaticInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
      [2])(peVar2,idat);
  }
  if (idat->excluded == false) {
    if ((*(byte *)(lVar1 + lVar13 * 4) & 2) != 0) {
      peVar3 = (this->lj_).super___shared_ptr<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar3->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar3,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 0x20) != 0) {
      peVar4 = (this->gb_).super___shared_ptr<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar4->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar4,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 0x10) != 0) {
      peVar5 = (this->sticky_).super___shared_ptr<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      (*(peVar5->super_HydrogenBondingInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar5,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 0x40) != 0) {
      peVar6 = (this->morse_).super___shared_ptr<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar6->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar6,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 0x80) != 0) {
      peVar7 = (this->repulsivePower_).
               super___shared_ptr<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar7->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar7,idat);
    }
    if ((*(byte *)(lVar1 + 1 + lVar13 * 4) & 2) != 0) {
      peVar8 = (this->mie_).super___shared_ptr<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar8->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar8,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 4) != 0) {
      peVar9 = (this->eam_).super___shared_ptr<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar9->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[2]
      )(peVar9,idat);
    }
    if ((*(byte *)(lVar1 + lVar13 * 4) & 8) != 0) {
      peVar10 = (this->sc_).super___shared_ptr<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar10->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar10,idat);
    }
    if ((*(byte *)(lVar1 + 1 + lVar13 * 4) & 1) != 0) {
      peVar11 = (this->maw_).super___shared_ptr<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar11->super_VanDerWaalsInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar11,idat);
    }
    if ((*(byte *)(lVar1 + 1 + lVar13 * 4) & 8) != 0) {
      peVar12 = (this->inversePowerSeries_).
                super___shared_ptr<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar12->super_VanDerWaalsInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar12,idat);
      return;
    }
  }
  return;
}

Assistant:

void InteractionManager::doPair(InteractionData& idat) {
    if (!initialized_) initialize();

    int& iHash = iHash_[idat.atid1][idat.atid2];

    if ((iHash & ELECTROSTATIC_INTERACTION) != 0)
      electrostatic_->calcForce(idat);

    // electrostatics still has to worry about indirect
    // contributions from excluded pairs of atoms, but nothing else does:

    if (idat.excluded) return;

    if ((iHash & LJ_INTERACTION) != 0) lj_->calcForce(idat);
    if ((iHash & GB_INTERACTION) != 0) gb_->calcForce(idat);
    if ((iHash & STICKY_INTERACTION) != 0) sticky_->calcForce(idat);
    if ((iHash & MORSE_INTERACTION) != 0) morse_->calcForce(idat);
    if ((iHash & REPULSIVEPOWER_INTERACTION) != 0)
      repulsivePower_->calcForce(idat);
    if ((iHash & MIE_INTERACTION) != 0) mie_->calcForce(idat);
    if ((iHash & EAM_INTERACTION) != 0) eam_->calcForce(idat);
    if ((iHash & SC_INTERACTION) != 0) sc_->calcForce(idat);
    if ((iHash & MAW_INTERACTION) != 0) maw_->calcForce(idat);
    if ((iHash & INVERSEPOWERSERIES_INTERACTION) != 0)
      inversePowerSeries_->calcForce(idat);

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[ idat.atypes ].begin();
    //      it != interactions_[ idat.atypes ].end(); ++it) {
    //
    //   if (!idat.excluded || (*it)->getFamily() == ELECTROSTATIC_FAMILY) {
    //     (*it)->calcForce(idat);
    //   }
    // }

    return;
  }